

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void nlohmann::detail::
     from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *j,string_t *s)

{
  type_error *__return_storage_ptr__;
  size_t sVar1;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (j->m_type == string) {
    std::__cxx11::string::_M_assign((string *)s);
    return;
  }
  __return_storage_ptr__ = (type_error *)__cxa_allocate_exception(0x20);
  if ((ulong)j->m_type < 9) {
    __s = (&PTR_anon_var_dwarf_437b1_00141c80)[j->m_type];
  }
  else {
    __s = "number";
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  sVar1 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,__s,__s + sVar1);
  std::operator+(&local_40,"type must be string, but is ",&local_60);
  type_error::create(__return_storage_ptr__,0x12e,&local_40);
  __cxa_throw(__return_storage_ptr__,&type_error::typeinfo,exception::~exception);
}

Assistant:

void from_json(const BasicJsonType& j, typename BasicJsonType::string_t& s)
{
    if (JSON_HEDLEY_UNLIKELY(not j.is_string()))
    {
        JSON_THROW(type_error::create(302, "type must be string, but is " + std::string(j.type_name())));
    }
    s = *j.template get_ptr<const typename BasicJsonType::string_t*>();
}